

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lecturedemorefine.cc
# Opt level: O0

void lecturedemo::regrefMeshSequence(shared_ptr<lf::mesh::Mesh> *mesh_p,int refsteps)

{
  RefEl RVar1;
  size_type sVar2;
  uint uVar3;
  element_type *this;
  element_type *peVar4;
  ostream *poVar5;
  Mesh *mesh;
  undefined1 local_58 [8];
  shared_ptr<const_lf::mesh::Mesh> lev_mesh_p;
  size_type level;
  size_type L;
  MeshHierarchy *multi_mesh;
  shared_ptr<lf::refinement::MeshHierarchy> multi_mesh_p;
  int refsteps_local;
  shared_ptr<lf::mesh::Mesh> *mesh_p_local;
  
  multi_mesh_p.super___shared_ptr<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = refsteps;
  lf::refinement::GenerateMeshHierarchyByUniformRefinemnt
            ((refinement *)&multi_mesh,mesh_p,refsteps,rp_regular);
  this = std::
         __shared_ptr_access<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator*((__shared_ptr_access<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&multi_mesh);
  std::operator<<((ostream *)&std::cout,"\t Sequence of nested meshes created\n");
  lf::refinement::MeshHierarchy::PrintInfo(this,(ostream *)&std::cout,0);
  sVar2 = lf::refinement::MeshHierarchy::NumLevels(this);
  for (lev_mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi._4_4_ = 0;
      lev_mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ < sVar2;
      lev_mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = lev_mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_4_ + 1) {
    lf::refinement::MeshHierarchy::getMesh((MeshHierarchy *)&mesh,(size_type)this);
    std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
              ((shared_ptr<lf::mesh::Mesh_const> *)local_58,(shared_ptr<lf::mesh::Mesh> *)&mesh);
    std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)&mesh);
    peVar4 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_58);
    poVar5 = std::operator<<((ostream *)&std::cout,"==== Mesh on level ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,lev_mesh_p.
                               super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._4_4_);
    poVar5 = std::operator<<(poVar5,": ");
    RVar1 = lf::base::RefEl::kPoint();
    uVar3 = (*peVar4->_vptr_Mesh[4])(peVar4,(ulong)RVar1.type_);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5," NODEs, ");
    RVar1 = lf::base::RefEl::kSegment();
    uVar3 = (*peVar4->_vptr_Mesh[4])(peVar4,(ulong)RVar1.type_);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5," EDGEs, ");
    RVar1 = lf::base::RefEl::kTria();
    uVar3 = (*peVar4->_vptr_Mesh[4])(peVar4,(ulong)RVar1.type_);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5," TRIAs, ");
    RVar1 = lf::base::RefEl::kQuad();
    uVar3 = (*peVar4->_vptr_Mesh[4])(peVar4,(ulong)RVar1.type_);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5," QUADs.");
    std::operator<<(poVar5,'\n');
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)local_58)
    ;
  }
  std::shared_ptr<lf::refinement::MeshHierarchy>::~shared_ptr
            ((shared_ptr<lf::refinement::MeshHierarchy> *)&multi_mesh);
  return;
}

Assistant:

void regrefMeshSequence(const std::shared_ptr<lf::mesh::Mesh>& mesh_p,
                        int refsteps) {
  const std::shared_ptr<lf::refinement::MeshHierarchy> multi_mesh_p =
      lf::refinement::GenerateMeshHierarchyByUniformRefinemnt(mesh_p, refsteps);
  lf::refinement::MeshHierarchy& multi_mesh{*multi_mesh_p};

  // Ouput summary information about hierarchy of nested meshes
  std::cout << "\t Sequence of nested meshes created\n";
  multi_mesh.PrintInfo(std::cout);
  // Number of levels
  const size_type L = multi_mesh.NumLevels();

  // Retrieve meshes on all levels
  for (size_type level = 0; level < L; ++level) {
    const std::shared_ptr<const lf::mesh::Mesh> lev_mesh_p =
        multi_mesh.getMesh(level);
    // Reference to current mesh
    const lf::mesh::Mesh& mesh{*lev_mesh_p};
    // Output of mesh information
    std::cout << "==== Mesh on level " << level << ": "
              << mesh.NumEntities(lf::base::RefEl::kPoint()) << " NODEs, "
              << mesh.NumEntities(lf::base::RefEl::kSegment()) << " EDGEs, "
              << mesh.NumEntities(lf::base::RefEl::kTria()) << " TRIAs, "
              << mesh.NumEntities(lf::base::RefEl::kQuad()) << " QUADs."
              << '\n';
  }
}